

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

void __thiscall
rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
          (maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *this,
          maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *other)

{
  pointer paVar1;
  
  this->m_empty = true;
  if (other->m_empty == false) {
    paVar1 = (other->field_0).m_value.
             super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (this->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (other->field_0).m_value.
         super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = paVar1;
    (this->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (other->field_0).m_value.
         super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (other->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (other->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (other->field_0).m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->m_empty = false;
    if (other->m_empty == false) {
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)other);
      other->m_empty = true;
    }
  }
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }